

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_msg * common_chat_parse(string *input,common_chat_format format)

{
  runtime_error *this;
  undefined4 in_EDX;
  common_chat_msg *in_RDI;
  common_chat_format in_stack_0000002c;
  string *in_stack_00000178;
  string *in_stack_000001f8;
  string *in_stack_00000208;
  bool in_stack_00000227;
  string *in_stack_00000228;
  bool in_stack_00000277;
  string *in_stack_00000278;
  common_chat_msg *__lhs;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffc8;
  bool in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  
  switch(in_EDX) {
  case 0:
    common_chat_parse_content_only
              ((string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 1:
    common_chat_parse_generic(in_stack_000001f8);
    break;
  case 2:
    common_chat_parse_mistral_nemo(in_stack_ffffffffffffffc8);
    break;
  case 3:
    common_chat_parse_llama_3_1(in_stack_00000278,in_stack_00000277);
    break;
  case 4:
    common_chat_parse_llama_3_1(in_stack_00000278,in_stack_00000277);
    break;
  case 5:
    common_chat_parse_deepseek_r1(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
    break;
  case 6:
    common_chat_parse_deepseek_r1(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
    break;
  case 7:
    common_chat_parse_firefunction_v2(in_stack_ffffffffffffffc8);
    break;
  case 8:
    common_chat_parse_functionary_v3_2(in_stack_00000178);
    break;
  case 9:
    common_chat_parse_functionary_v3_1_llama_3_1(in_stack_00000208);
    break;
  case 10:
    common_chat_parse_hermes_2_pro(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
    break;
  case 0xb:
    common_chat_parse_hermes_2_pro(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
    break;
  case 0xc:
    common_chat_parse_command_r7b(in_stack_00000228,in_stack_00000227);
    break;
  case 0xd:
    common_chat_parse_command_r7b(in_stack_00000228,in_stack_00000227);
    break;
  default:
    __lhs = in_RDI;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    common_chat_format_name_abi_cxx11_(in_stack_0000002c);
    std::operator+((char *)__lhs,&in_RDI->role);
    std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffffc8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return in_RDI;
}

Assistant:

common_chat_msg common_chat_parse(const std::string & input, common_chat_format format) {
    switch (format) {
        case COMMON_CHAT_FORMAT_CONTENT_ONLY:
            return common_chat_parse_content_only(input);
        case COMMON_CHAT_FORMAT_GENERIC:
            return common_chat_parse_generic(input);
        case COMMON_CHAT_FORMAT_MISTRAL_NEMO:
            return common_chat_parse_mistral_nemo(input);
        case COMMON_CHAT_FORMAT_LLAMA_3_X:
            return common_chat_parse_llama_3_1(input);
        case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS:
            return common_chat_parse_llama_3_1(input, /* with_builtin_tools= */ true);
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1:
            return common_chat_parse_deepseek_r1(input, /* extract_reasoning= */ false);
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING:
            return common_chat_parse_deepseek_r1(input, /* extract_reasoning= */ true);
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2:
            return common_chat_parse_functionary_v3_2(input);
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1:
            return common_chat_parse_functionary_v3_1_llama_3_1(input);
        case COMMON_CHAT_FORMAT_HERMES_2_PRO:
            return common_chat_parse_hermes_2_pro(input, /* extract_reasoning= */ false);
        case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING:
            return common_chat_parse_hermes_2_pro(input, /* extract_reasoning= */ true);
        case COMMON_CHAT_FORMAT_FIREFUNCTION_V2:
            return common_chat_parse_firefunction_v2(input);
        case COMMON_CHAT_FORMAT_COMMAND_R7B:
            return common_chat_parse_command_r7b(input, /* extract_reasoning= */ false);
        case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING:
            return common_chat_parse_command_r7b(input, /* extract_reasoning= */ true);
        default:
            throw std::runtime_error("Unsupported format: " + common_chat_format_name(format));
    }
}